

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O0

void fold_2(__m128i *xmm_crc0,__m128i *xmm_crc1,__m128i *xmm_crc2,__m128i *xmm_crc3)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  __m128i xmm_fold4;
  ulong local_c8;
  ulong uStack_c0;
  __m128 ps_res20;
  __m128 ps_res31;
  __m128 ps_crc3;
  __m128 ps_crc2;
  __m128 ps_crc1;
  __m128 ps_crc0;
  __m128i x_tmp2;
  __m128i x_tmp3;
  
  auVar1 = vpinsrd_avx(ZEXT416(0xc6e41596),1,1);
  auVar1 = vpinsrd_avx(auVar1,0x54442bd4,2);
  auVar1 = vpinsrd_avx(auVar1,1,3);
  local_c8 = auVar1._0_8_;
  uStack_c0 = auVar1._8_8_;
  uVar11 = *(undefined8 *)*in_RCX;
  uVar12 = *(undefined8 *)(*in_RCX + 8);
  uVar13 = *(undefined8 *)*in_RDX;
  uVar14 = *(undefined8 *)(*in_RDX + 8);
  uVar15 = *(undefined8 *)(*in_RSI + 8);
  *(undefined8 *)*in_RCX = *(undefined8 *)*in_RSI;
  *(undefined8 *)(*in_RCX + 8) = uVar15;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(*in_RSI + 8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_c8;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar3 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar5 << uVar2;
    }
  }
  *in_RSI = auVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)*in_RCX;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uStack_c0;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar7 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar9 << uVar2;
    }
  }
  *in_RCX = auVar1;
  uVar16 = *(ulong *)*in_RCX;
  uVar17 = *(ulong *)(*in_RCX + 8);
  uVar18 = *(ulong *)*in_RSI;
  uVar19 = *(ulong *)(*in_RSI + 8);
  uVar15 = *(undefined8 *)(*in_RDI + 8);
  *(undefined8 *)*in_RDX = *(undefined8 *)*in_RDI;
  *(undefined8 *)(*in_RDX + 8) = uVar15;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(*in_RDI + 8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_c8;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar6 << uVar2;
    }
  }
  *in_RDI = auVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)*in_RDX;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uStack_c0;
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar8 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar10 << uVar2;
    }
  }
  *in_RDX = auVar1;
  uVar20 = *(ulong *)*in_RDI;
  uVar21 = *(ulong *)(*in_RDI + 8);
  uVar22 = *(ulong *)*in_RDX;
  uVar23 = *(ulong *)(*in_RDX + 8);
  *(undefined8 *)*in_RDI = uVar13;
  *(undefined8 *)(*in_RDI + 8) = uVar14;
  *(undefined8 *)*in_RSI = uVar11;
  *(undefined8 *)(*in_RSI + 8) = uVar12;
  *(ulong *)*in_RDX = uVar20 ^ uVar22;
  *(ulong *)(*in_RDX + 8) = uVar21 ^ uVar23;
  *(ulong *)*in_RCX = uVar16 ^ uVar18;
  *(ulong *)(*in_RCX + 8) = uVar17 ^ uVar19;
  return;
}

Assistant:

static void fold_2(__m128i *xmm_crc0, __m128i *xmm_crc1, __m128i *xmm_crc2, __m128i *xmm_crc3) {
    const __m128i xmm_fold4 = _mm_set_epi32( 0x00000001, 0x54442bd4,
                                             0x00000001, 0xc6e41596);
    __m128i x_tmp3, x_tmp2;
    __m128 ps_crc0, ps_crc1, ps_crc2, ps_crc3, ps_res31, ps_res20;

    x_tmp3 = *xmm_crc3;
    x_tmp2 = *xmm_crc2;

    *xmm_crc3 = *xmm_crc1;
    *xmm_crc1 = _mm_clmulepi64_si128(*xmm_crc1, xmm_fold4, 0x01);
    *xmm_crc3 = _mm_clmulepi64_si128(*xmm_crc3, xmm_fold4, 0x10);
    ps_crc3 = _mm_castsi128_ps(*xmm_crc3);
    ps_crc1 = _mm_castsi128_ps(*xmm_crc1);
    ps_res31 = _mm_xor_ps(ps_crc3, ps_crc1);

    *xmm_crc2 = *xmm_crc0;
    *xmm_crc0 = _mm_clmulepi64_si128(*xmm_crc0, xmm_fold4, 0x01);
    *xmm_crc2 = _mm_clmulepi64_si128(*xmm_crc2, xmm_fold4, 0x10);
    ps_crc0 = _mm_castsi128_ps(*xmm_crc0);
    ps_crc2 = _mm_castsi128_ps(*xmm_crc2);
    ps_res20 = _mm_xor_ps(ps_crc0, ps_crc2);

    *xmm_crc0 = x_tmp2;
    *xmm_crc1 = x_tmp3;
    *xmm_crc2 = _mm_castps_si128(ps_res20);
    *xmm_crc3 = _mm_castps_si128(ps_res31);
}